

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ir.h
# Opt level: O3

void __thiscall wabt::ExceptionImport::ExceptionImport(ExceptionImport *this,string_view name)

{
  string_view local_28;
  
  local_28.size_ = name.size_;
  local_28.data_ = name.data_;
  (this->super_ImportMixin<(wabt::ExternalKind)4>).super_Import.module_name._M_dataplus._M_p =
       (pointer)&(this->super_ImportMixin<(wabt::ExternalKind)4>).super_Import.module_name.field_2;
  (this->super_ImportMixin<(wabt::ExternalKind)4>).super_Import.module_name._M_string_length = 0;
  (this->super_ImportMixin<(wabt::ExternalKind)4>).super_Import.module_name.field_2._M_local_buf[0]
       = '\0';
  (this->super_ImportMixin<(wabt::ExternalKind)4>).super_Import.field_name._M_dataplus._M_p =
       (pointer)&(this->super_ImportMixin<(wabt::ExternalKind)4>).super_Import.field_name.field_2;
  (this->super_ImportMixin<(wabt::ExternalKind)4>).super_Import.field_name._M_string_length = 0;
  (this->super_ImportMixin<(wabt::ExternalKind)4>).super_Import.field_name.field_2._M_local_buf[0] =
       '\0';
  (this->super_ImportMixin<(wabt::ExternalKind)4>).super_Import.kind_ = Except;
  (this->super_ImportMixin<(wabt::ExternalKind)4>).super_Import._vptr_Import =
       (_func_int **)&PTR__ExceptionImport_015446f8;
  string_view::to_string_abi_cxx11_(&(this->except).name,&local_28);
  (this->except).sig.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->except).sig.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->except).sig.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  return;
}

Assistant:

explicit ExceptionImport(string_view name = string_view())
      : ImportMixin<ExternalKind::Except>(), except(name) {}